

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_codeshell::llm_build_codeshell
          (llm_build_codeshell *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  uint32_t uVar2;
  ggml_tensor *q_cur;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *name;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *gate_s;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  pointer plVar16;
  ggml_tensor *pgVar17;
  void *in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd78;
  int iVar18;
  llama_hparams *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd98;
  undefined4 uVar19;
  llm_graph_context *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *pgVar20;
  ggml_tensor *in_stack_fffffffffffffe18;
  ggml_tensor *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_00;
  void *pvVar21;
  ggml_tensor *in_stack_fffffffffffffe88;
  llm_graph_context *in_stack_fffffffffffffe90;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t uVar22;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff90;
  int iVar23;
  ggml_tensor *pgVar24;
  ggml_tensor *local_58;
  ggml_tensor *local_50;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd90,
             (llm_graph_params *)in_stack_fffffffffffffd88);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  uVar2 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20))
  ;
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1d4e,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1d4f,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  uVar22 = uVar2;
  local_58 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pgVar17 = local_58;
  q_cur = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffde0);
  pgVar24 = q_cur;
  pgVar3 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe20);
  pgVar15 = pgVar3;
  for (iVar23 = 0; iVar18 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
      (long)iVar23 < in_RDI->ne[3]; iVar23 = iVar23 + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,(llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               (int)in_stack_fffffffffffffd80);
    uVar19 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar18);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        in_stack_fffffffffffffdd0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar18);
    pgVar14 = in_RDI->src[5];
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar23);
    lVar6 = ggml_add(pgVar14,pgVar4,pvVar5->bqkv);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar18);
    pgVar14 = in_RDI->src[5];
    uVar7 = ggml_view_2d(pgVar14,lVar6,in_RDI->ne[2],(long)*(int *)(in_RDI->src + 2),
                         *(undefined8 *)(lVar6 + 0x38),0);
    uVar7 = ggml_cont(pgVar14,uVar7);
    pgVar14 = in_RDI->src[5];
    uVar8 = ggml_view_2d(pgVar14,lVar6,uVar2,(long)*(int *)(in_RDI->src + 2),
                         *(undefined8 *)(lVar6 + 0x38),in_RDI->ne[2] << 2);
    uVar8 = ggml_cont(pgVar14,uVar8);
    pgVar14 = in_RDI->src[5];
    uVar9 = ggml_view_2d();
    uVar9 = ggml_cont(pgVar14,uVar9);
    uVar10 = ggml_reshape_3d(in_RDI->src[5],uVar7,uVar1,in_RDI->nb[3],
                             (long)*(int *)(in_RDI->src + 2));
    uVar7._0_4_ = in_RDI->op;
    uVar7._4_4_ = in_RDI->op_params[0];
    uVar7 = ggml_reshape_3d(in_RDI->src[5],uVar8,uVar1,uVar7,(long)*(int *)(in_RDI->src + 2));
    uVar8._0_4_ = in_RDI->op;
    uVar8._4_4_ = in_RDI->op_params[0];
    name = (ggml_tensor *)
           ggml_reshape_3d(in_RDI->src[5],uVar9,uVar1,uVar8,(long)*(int *)(in_RDI->src + 2));
    pgVar11 = (ggml_tensor *)
              ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                            in_RDI->flags,*(undefined4 *)in_RDI->src,
                            *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar10,pgVar24,0,
                            (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    pgVar12 = (ggml_tensor *)
              ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                            in_RDI->flags,*(undefined4 *)in_RDI->src,
                            *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar7,pgVar24,0,
                            (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar18);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar18);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar18);
    pvVar21 = in_RCX;
    pgVar20 = pgVar15;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    il_00 = (int)pvVar21;
    type_gate = (llm_ffn_gate_type)pgVar15;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    pgVar4 = pgVar12;
    sqrtf((float)uVar1);
    pgVar13 = (ggml_tensor *)CONCAT44(uVar19,iVar23);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar14 = name;
    pgVar15 = pgVar12;
    local_50 = llm_graph_context::build_attn
                         ((llm_graph_context *)in_stack_ffffffffffffff70,
                          (llm_graph_input_attn_kv_unified *)in_stack_ffffffffffffff68,
                          (ggml_cgraph *)CONCAT44(uVar22,in_stack_ffffffffffffff60),in_RDI,pgVar17,
                          q_cur,pgVar4,pgVar11,
                          (ggml_tensor *)CONCAT44(iVar23,in_stack_ffffffffffffff90),pgVar20,
                          (float)((ulong)pgVar3 >> 0x20),(int)pgVar24);
    type_op = (llm_ffn_op_type)pgVar15;
    iVar18 = (int)((ulong)pgVar12 >> 0x20);
    pgVar15 = pgVar20;
    if ((long)iVar23 == in_RDI->ne[3] + -1) {
      in_stack_fffffffffffffe50 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffdd0);
      in_stack_ffffffffffffff70 = in_stack_fffffffffffffe50;
      local_50 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe48 = local_50;
      in_stack_fffffffffffffe40 =
           (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_58,in_stack_ffffffffffffff70);
      pgVar15 = pgVar20;
      local_58 = in_stack_fffffffffffffe40;
    }
    gate_s = (ggml_tensor *)ggml_add(in_RDI->src[5],local_50,local_58);
    pgVar12 = gate_s;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar18);
    in_stack_ffffffffffffff68 = pgVar12;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar23);
    pgVar13 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffda0,pgVar13,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    pgVar11 = pgVar13;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar18);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar23);
    pgVar4 = pvVar5->ffn_up;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar23);
    pgVar20 = pvVar5->ffn_up_b;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar23);
    in_stack_fffffffffffffd88 = pvVar5->ffn_down;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar23);
    in_stack_fffffffffffffd90 = pvVar5->ffn_down_b;
    in_stack_fffffffffffffda0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd98 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd80 = (llama_hparams *)0x0;
    in_stack_fffffffffffffd78 = (ggml_tensor *)0x0;
    pgVar14 = llm_graph_context::build_ffn
                        ((llm_graph_context *)pgVar12,in_stack_fffffffffffffe18,
                         (ggml_tensor *)&stack0xfffffffffffffd78,pgVar20,pgVar4,pgVar13,pgVar11,
                         gate_s,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,pgVar14,type_op,type_gate,il_00);
    in_stack_fffffffffffffe18 = pgVar14;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar14,in_stack_ffffffffffffff68);
    local_58 = llm_graph_context::build_cvec
                         ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0
                         );
    in_stack_fffffffffffffde0 = local_58;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  }
  pgVar15 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
                       ,in_stack_fffffffffffffd88,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                       (int)in_stack_fffffffffffffd80);
  pgVar17 = pgVar15;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             &in_stack_fffffffffffffd80->vocab_only,iVar18);
  plVar16 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d6d7f);
  plVar16->t_embd = pgVar15;
  pgVar17 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffde0,pgVar17,
                       in_stack_fffffffffffffdd0);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             &in_stack_fffffffffffffd80->vocab_only,iVar18);
  plVar16 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d6e04);
  plVar16->t_logits = pgVar17;
  ggml_build_forward_expand(in_RCX,pgVar17);
  return;
}

Assistant:

llm_build_codeshell(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }